

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3InitHashTable(sqlite3 *db,Fts3Hash *pHash,char *zName)

{
  int any;
  void *p;
  int rc;
  char *zName_local;
  Fts3Hash *pHash_local;
  sqlite3 *db_local;
  
  p._4_4_ = sqlite3_create_function
                      (db,zName,1,5,pHash,fts3TokenizerFunc,
                       (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                       (_func_void_sqlite3_context_ptr *)0x0);
  if (p._4_4_ == 0) {
    p._4_4_ = sqlite3_create_function
                        (db,zName,2,5,pHash,fts3TokenizerFunc,
                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                         (_func_void_sqlite3_context_ptr *)0x0);
  }
  return p._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitHashTable(
  sqlite3 *db, 
  Fts3Hash *pHash, 
  const char *zName
){
  int rc = SQLITE_OK;
  void *p = (void *)pHash;
  const int any = SQLITE_ANY;

#ifdef SQLITE_TEST
  char *zTest = 0;
  char *zTest2 = 0;
  void *pdb = (void *)db;
  zTest = sqlite3_mprintf("%s_test", zName);
  zTest2 = sqlite3_mprintf("%s_internal_test", zName);
  if( !zTest || !zTest2 ){
    rc = SQLITE_NOMEM;
  }
#endif

  if( SQLITE_OK==rc ){
    rc = sqlite3_create_function(db, zName, 1, any, p, fts3TokenizerFunc, 0, 0);
  }
  if( SQLITE_OK==rc ){
    rc = sqlite3_create_function(db, zName, 2, any, p, fts3TokenizerFunc, 0, 0);
  }
#ifdef SQLITE_TEST
  if( SQLITE_OK==rc ){
    rc = sqlite3_create_function(db, zTest, -1, any, p, testFunc, 0, 0);
  }
  if( SQLITE_OK==rc ){
    rc = sqlite3_create_function(db, zTest2, 0, any, pdb, intTestFunc, 0, 0);
  }
#endif

#ifdef SQLITE_TEST
  sqlite3_free(zTest);
  sqlite3_free(zTest2);
#endif

  return rc;
}